

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_update1_ghosts(Integer g_a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char **ppcVar6;
  char *pcVar7;
  C_Integer *pCVar8;
  bool bVar9;
  ushort uVar10;
  Integer proc;
  logical lVar11;
  Integer *map;
  Integer *proclist;
  long grp_id;
  long lVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int _d;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  C_Integer CVar27;
  long lVar28;
  ushort uVar29;
  int iVar30;
  long lVar31;
  char *pcVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int local_6d0;
  int _index [7];
  Integer np;
  Integer _hi [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_rem [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer lo_rem [7];
  Integer dims [7];
  Integer phi_rem [7];
  Integer thi_rem [7];
  Integer hi_rem [7];
  Integer tlo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer width [7];
  Integer increment [7];
  
  proc = pnga_nodeid();
  lVar11 = pnga_has_ghosts(g_a);
  IVar16 = GAnproc;
  if (lVar11 != 0) {
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
      IVar16 = GAnproc;
    }
    lVar1 = g_a + 1000;
    proclist = (Integer *)malloc(IVar16 << 3);
    if (proclist == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);
    }
    iVar2 = GA[lVar1].elemsize;
    lVar28 = (long)GA[lVar1].ndim;
    iVar3 = GA[lVar1].corner_flag;
    iVar4 = GA[lVar1].p_handle;
    grp_id = (long)iVar4;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    lVar19 = 0;
    if (0 < lVar28) {
      lVar19 = lVar28;
    }
    bVar9 = true;
    for (lVar31 = 0; lVar19 * 8 - lVar31 != 0; lVar31 = lVar31 + 8) {
      *(undefined8 *)((long)increment + lVar31) = 0;
      *(undefined8 *)((long)width + lVar31) = *(undefined8 *)((long)GA[g_a + 1000].width + lVar31);
      *(undefined8 *)((long)dims + lVar31) = *(undefined8 *)((long)GA[g_a + 1000].dims + lVar31);
      if ((*(long *)((long)lo_loc + lVar31) == 0) && (*(long *)((long)hi_loc + lVar31) == -1)) {
        bVar9 = false;
      }
    }
    local_6d0 = (int)proc;
    lVar12 = (long)local_6d0;
    lVar31 = lVar28 + -1;
    lVar20 = 0;
    if (0 < lVar31) {
      lVar20 = lVar31;
    }
    lVar40 = 0;
    for (lVar42 = 0; lVar42 != lVar19; lVar42 = lVar42 + 1) {
      lVar5 = width[lVar42];
      if ((lVar5 != 0) && (bVar9)) {
        for (lVar13 = 0; lVar28 != lVar13; lVar13 = lVar13 + 1) {
          if (lVar42 == lVar13) {
            lVar18 = lo_loc[lVar42];
            hi_rem[lVar42] = lVar18 + -1;
            lVar40 = 1;
            lo_rem[lVar42] = lVar18 - lVar5;
            if (lVar18 - lVar5 == 0 || lVar18 < lVar5) {
              lVar40 = (ulong)(1 < lVar18) + 1;
            }
          }
          else {
            lo_rem[lVar13] = lo_loc[lVar13];
            hi_rem[lVar13] = hi_loc[lVar13];
          }
        }
        lVar13 = 0;
        if (lVar40 != 0) {
          lVar13 = lVar40;
        }
        for (lVar18 = 0; lVar18 != lVar13; lVar18 = lVar18 + 1) {
          for (lVar14 = 0; lVar28 != lVar14; lVar14 = lVar14 + 1) {
            if (lVar42 == lVar14 && lVar40 == 2) {
              if (lVar18 == 0) {
                slo_rem[lVar42] = 1;
LAB_00172b16:
                lVar21 = hi_rem[lVar42];
              }
              else {
                lVar21 = dims[lVar42];
                slo_rem[lVar42] = lo_rem[lVar42] + lVar21;
              }
              shi_rem[lVar42] = lVar21;
            }
            else if (lVar42 == lVar14) {
              if (0 < lo_rem[lVar42]) {
                slo_rem[lVar42] = lo_rem[lVar42];
                goto LAB_00172b16;
              }
              shi_rem[lVar42] = dims[lVar42];
              slo_rem[lVar42] = (dims[lVar42] - lVar5) + 1;
            }
            else {
              slo_rem[lVar14] = lo_rem[lVar14];
              shi_rem[lVar14] = hi_rem[lVar14];
            }
          }
          lVar11 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
          if (lVar11 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar15 = strlen(err_string);
            sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
            sVar15 = strlen(err_string);
            lVar14 = 1;
            while( true ) {
              IVar16 = pnga_ndim(g_a);
              pcVar32 = err_string + (int)sVar15;
              if (IVar16 <= lVar14) break;
              sprintf(pcVar32,",%ld:%ld ",slo_rem[lVar14],shi_rem[lVar14]);
              sVar15 = strlen(err_string);
              lVar14 = lVar14 + 1;
            }
            pcVar32[0] = ']';
            pcVar32[1] = '\0';
            pnga_error(err_string,g_a);
          }
          for (lVar14 = 0; lVar14 < np; lVar14 = lVar14 + 1) {
            uVar39 = proclist[lVar14];
            pnga_distribution(g_a,uVar39,tlo_rem,thi_rem);
            for (lVar21 = 0; lVar28 != lVar21; lVar21 = lVar21 + 1) {
              if (increment[lVar21] == 0) {
                if (lVar42 == lVar21) {
                  if (np == 1 && lVar40 == 1) {
                    plo_rem[lVar42] = (thi_rem[lVar42] - tlo_rem[lVar42]) + 1;
                    phi_rem[lVar42] = (thi_rem[lVar42] - tlo_rem[lVar42]) + lVar5;
                    plo_loc[lVar42] = 0;
                  }
                  else {
                    lVar33 = tlo_rem[lVar42];
                    if (lVar33 < slo_rem[lVar42]) {
                      lVar23 = thi_rem[lVar42];
                      lVar22 = slo_rem[lVar42] - lVar23;
                      lVar36 = 0;
                    }
                    else {
                      lVar23 = thi_rem[lVar42];
                      lVar22 = lVar33 - lVar23;
                      lVar36 = lVar33 - lo_rem[lVar42];
                      if (lVar36 < 0) {
                        lVar36 = lVar36 + dims[lVar42];
                      }
                    }
                    lVar24 = 0;
                    if (dims[lVar42] <= lVar36) {
                      lVar24 = dims[lVar42];
                    }
                    lVar33 = (lVar23 - lVar33) + lVar5;
                    plo_rem[lVar42] = lVar22 + lVar33;
                    phi_rem[lVar42] = lVar33;
                    plo_loc[lVar42] = lVar36 - lVar24;
                  }
                }
                else {
                  lVar33 = width[lVar21];
                  plo_rem[lVar21] = lVar33;
                  phi_rem[lVar21] = (thi_rem[lVar21] + lVar33) - tlo_rem[lVar21];
                  plo_loc[lVar21] = lVar33;
                }
              }
              else {
                plo_rem[lVar21] = 0;
                phi_rem[lVar21] = (increment[lVar21] + thi_rem[lVar21]) - tlo_rem[lVar21];
                plo_loc[lVar21] = 0;
              }
            }
            uVar29 = GA[lVar1].ndim;
            lVar21 = (long)(short)uVar29;
            iVar35 = GA[lVar1].distr_type;
            if (iVar35 - 1U < 3) {
              lVar23 = lVar12 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar23;
              IVar16 = proc;
              lVar33 = 0;
              while (lVar33 + 1 < lVar21) {
                IVar16 = (long)((int)IVar16 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar33];
                lVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                _index[lVar33 + 1] = (int)lVar23;
                lVar33 = lVar33 + 1;
              }
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              for (lVar33 = 0; (ulong)uVar10 * 4 != lVar33; lVar33 = lVar33 + 4) {
                iVar34 = *(int *)((long)_index + lVar33);
                lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                *(long *)(err_string + lVar33 * 2) = lVar23 * iVar34 + 1;
                lVar23 = ((long)iVar34 + 1) * lVar23;
                lVar22 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                if (lVar22 <= lVar23) {
                  lVar23 = lVar22;
                }
                *(long *)((long)_hi + lVar33 * 2) = lVar23;
              }
            }
            else if (iVar35 == 4) {
              lVar23 = lVar12 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar23;
              IVar16 = proc;
              lVar33 = 0;
              while (lVar33 + 1 < lVar21) {
                IVar16 = (long)((int)IVar16 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar33];
                lVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                _index[lVar33 + 1] = (int)lVar23;
                lVar33 = lVar33 + 1;
              }
              lVar33 = 0;
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              iVar34 = 0;
              for (; (ulong)uVar10 * 4 != lVar33; lVar33 = lVar33 + 4) {
                pCVar8 = GA[lVar1].mapc;
                iVar30 = *(int *)((long)_index + lVar33);
                lVar22 = (long)iVar34 + (long)iVar30;
                *(C_Integer *)(err_string + lVar33 * 2) = pCVar8[lVar22];
                lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                if ((long)iVar30 < lVar23 + -1) {
                  lVar22 = pCVar8[lVar22 + 1] + -1;
                }
                else {
                  lVar22 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                }
                *(long *)((long)_hi + lVar33 * 2) = lVar22;
                iVar34 = iVar34 + (int)lVar23;
              }
            }
            else if (iVar35 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar33 = 0;
                if (0 < lVar21) {
                  lVar33 = lVar21;
                }
                lVar23 = 1;
                for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                  lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar22];
                }
                if ((proc < 0) || (lVar23 <= proc)) {
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lo_rem[lVar23 + -0x20] = 0;
                    _hi[lVar23] = -1;
                  }
                }
                else {
                  lVar23 = 0;
                  IVar16 = proc;
                  for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                    lVar24 = (long)GA[g_a + 1000].nblock[lVar22];
                    lVar36 = IVar16 % lVar24;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar22 + -0x20] = pCVar8[lVar36 + lVar23];
                    if (lVar36 == lVar24 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar22];
                    }
                    else {
                      CVar27 = pCVar8[lVar36 + lVar23 + 1] + -1;
                    }
                    lVar23 = lVar23 + lVar24;
                    _hi[lVar22] = CVar27;
                    IVar16 = IVar16 / lVar24;
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                lVar33 = 0;
                if (0 < lVar21) {
                  lVar33 = lVar21;
                }
                lVar23 = 1;
                for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                  lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar22];
                }
                if ((proc < 0) || (lVar23 <= proc)) {
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lo_rem[lVar23 + -0x20] = 0;
                    _hi[lVar23] = -1;
                  }
                }
                else {
                  lVar23 = 0;
                  IVar16 = proc;
                  for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                    lVar24 = (long)GA[g_a + 1000].nblock[lVar22];
                    lVar36 = IVar16 % lVar24;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar22 + -0x20] = pCVar8[lVar36 + lVar23];
                    if (lVar36 == lVar24 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar22];
                    }
                    else {
                      CVar27 = pCVar8[lVar36 + lVar23 + 1] + -1;
                    }
                    lVar23 = lVar23 + lVar24;
                    _hi[lVar22] = CVar27;
                    IVar16 = IVar16 / lVar24;
                  }
                }
              }
              else {
                iVar34 = 0;
                if (0 < (short)uVar29) {
                  iVar34 = (int)(short)uVar29;
                }
                for (lVar33 = 0; iVar34 != lVar33; lVar33 = lVar33 + 1) {
                  lo_rem[lVar33 + -0x20] = 0;
                  _hi[lVar33] = -1;
                }
              }
            }
            lVar33 = lVar21 + -1;
            if (lVar33 == 0) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar23 = 0;
            if (0 < lVar33) {
              lVar23 = lVar33;
            }
            lVar36 = 0;
            lVar22 = 1;
            for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
              lVar36 = lVar36 + plo_loc[lVar24] * lVar22;
              lVar37 = (_hi[lVar24] - lo_rem[lVar24 + -0x20]) + GA[g_a + 1000].width[lVar24] * 2 + 1
              ;
              ld_loc[lVar24] = lVar37;
              lVar22 = lVar22 * lVar37;
            }
            lVar24 = plo_loc[lVar21 + -1];
            ppcVar6 = GA[lVar1].ptr;
            iVar34 = GA[lVar1].elemsize;
            pcVar32 = ppcVar6[proc];
            if (iVar35 - 1U < 3) {
              lVar25 = (long)(int)uVar39 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar25;
              uVar17 = uVar39;
              lVar37 = 0;
              while (lVar37 + 1 < lVar21) {
                uVar17 = (long)((int)uVar17 - (int)lVar25) / GA[g_a + 1000].num_blocks[lVar37];
                lVar25 = (long)(int)uVar17 % GA[g_a + 1000].num_blocks[lVar37 + 1];
                _index[lVar37 + 1] = (int)lVar25;
                lVar37 = lVar37 + 1;
              }
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              for (lVar37 = 0; (ulong)uVar10 * 4 != lVar37; lVar37 = lVar37 + 4) {
                iVar35 = *(int *)((long)_index + lVar37);
                lVar25 = *(long *)((long)GA[g_a + 1000].block_dims + lVar37 * 2);
                *(long *)(err_string + lVar37 * 2) = lVar25 * iVar35 + 1;
                lVar25 = ((long)iVar35 + 1) * lVar25;
                lVar38 = *(long *)((long)GA[g_a + 1000].dims + lVar37 * 2);
                if (lVar38 <= lVar25) {
                  lVar25 = lVar38;
                }
                *(long *)((long)_hi + lVar37 * 2) = lVar25;
              }
            }
            else if (iVar35 == 4) {
              lVar25 = (long)(int)uVar39 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar25;
              uVar17 = uVar39;
              lVar37 = 0;
              while (lVar37 + 1 < lVar21) {
                uVar17 = (long)((int)uVar17 - (int)lVar25) / GA[g_a + 1000].num_blocks[lVar37];
                lVar25 = (long)(int)uVar17 % GA[g_a + 1000].num_blocks[lVar37 + 1];
                _index[lVar37 + 1] = (int)lVar25;
                lVar37 = lVar37 + 1;
              }
              lVar37 = 0;
              if ((short)uVar29 < 1) {
                uVar29 = 0;
              }
              iVar35 = 0;
              for (; (ulong)uVar29 * 4 != lVar37; lVar37 = lVar37 + 4) {
                pCVar8 = GA[lVar1].mapc;
                iVar30 = *(int *)((long)_index + lVar37);
                lVar38 = (long)iVar35 + (long)iVar30;
                *(C_Integer *)(err_string + lVar37 * 2) = pCVar8[lVar38];
                lVar25 = *(long *)((long)GA[lVar1].num_blocks + lVar37 * 2);
                if ((long)iVar30 < lVar25 + -1) {
                  lVar38 = pCVar8[lVar38 + 1] + -1;
                }
                else {
                  lVar38 = *(long *)((long)GA[lVar1].dims + lVar37 * 2);
                }
                *(long *)((long)_hi + lVar37 * 2) = lVar38;
                iVar35 = iVar35 + (int)lVar25;
              }
            }
            else if (iVar35 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar37 = lVar21;
                if (lVar21 < 1) {
                  lVar37 = 0;
                }
                lVar25 = 1;
                for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                  lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar38];
                }
                if (((long)uVar39 < 0) || (lVar25 <= (long)uVar39)) {
                  for (lVar25 = 0; lVar37 != lVar25; lVar25 = lVar25 + 1) {
                    lo_rem[lVar25 + -0x20] = 0;
                    _hi[lVar25] = -1;
                  }
                }
                else {
                  lVar25 = 0;
                  uVar17 = uVar39;
                  for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                    lVar41 = (long)GA[g_a + 1000].nblock[lVar38];
                    lVar26 = (long)uVar17 % lVar41;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar38 + -0x20] = pCVar8[lVar26 + lVar25];
                    if (lVar26 == lVar41 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar38];
                    }
                    else {
                      CVar27 = pCVar8[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar41;
                    _hi[lVar38] = CVar27;
                    uVar17 = (long)uVar17 / lVar41;
                  }
                }
              }
              else if ((long)uVar39 < GA[lVar1].num_rstrctd) {
                lVar37 = lVar21;
                if (lVar21 < 1) {
                  lVar37 = 0;
                }
                lVar25 = 1;
                for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                  lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar38];
                }
                if (((long)uVar39 < 0) || (lVar25 <= (long)uVar39)) {
                  for (lVar25 = 0; lVar37 != lVar25; lVar25 = lVar25 + 1) {
                    lo_rem[lVar25 + -0x20] = 0;
                    _hi[lVar25] = -1;
                  }
                }
                else {
                  lVar25 = 0;
                  uVar17 = uVar39;
                  for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                    lVar41 = (long)GA[g_a + 1000].nblock[lVar38];
                    lVar26 = (long)uVar17 % lVar41;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar38 + -0x20] = pCVar8[lVar26 + lVar25];
                    if (lVar26 == lVar41 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar38];
                    }
                    else {
                      CVar27 = pCVar8[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar41;
                    _hi[lVar38] = CVar27;
                    uVar17 = (long)uVar17 / lVar41;
                  }
                }
              }
              else {
                iVar35 = 0;
                if (0 < (short)uVar29) {
                  iVar35 = (int)(short)uVar29;
                }
                for (lVar37 = 0; iVar35 != lVar37; lVar37 = lVar37 + 1) {
                  lo_rem[lVar37 + -0x20] = 0;
                  _hi[lVar37] = -1;
                }
              }
            }
            if (lVar33 == 0) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar33 = 1;
            lVar37 = 0;
            for (lVar25 = 0; lVar23 != lVar25; lVar25 = lVar25 + 1) {
              lVar37 = lVar37 + plo_rem[lVar25] * lVar33;
              lVar38 = (_hi[lVar25] - lo_rem[lVar25 + -0x20]) + GA[g_a + 1000].width[lVar25] * 2 + 1
              ;
              ld_rem[lVar25] = lVar38;
              lVar33 = lVar33 * lVar38;
            }
            lVar21 = *(long *)(stride_loc + lVar21 * 2 + 6);
            pcVar7 = ppcVar6[uVar39];
            stride_loc[0] = iVar2;
            stride_rem[0] = iVar2;
            iVar35 = iVar2;
            iVar30 = iVar2;
            for (lVar23 = 0; lVar20 << 2 != lVar23; lVar23 = lVar23 + 4) {
              iVar35 = iVar35 * *(int *)((long)ld_rem + lVar23 * 2);
              *(int *)((long)stride_rem + lVar23) = iVar35;
              iVar30 = iVar30 * *(int *)((long)ld_loc + lVar23 * 2);
              *(int *)((long)stride_loc + lVar23) = iVar30;
              *(int *)((long)stride_rem + lVar23 + 4) = iVar35;
              *(int *)((long)stride_loc + lVar23 + 4) = iVar30;
            }
            for (lVar23 = 0; lVar28 != lVar23; lVar23 = lVar23 + 1) {
              count[lVar23] = ((int)phi_rem[lVar23] - (int)plo_rem[lVar23]) + 1;
            }
            count[0] = count[0] * iVar2;
            if (-1 < iVar4) {
              uVar39 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar39];
            }
            ARMCI_GetS(pcVar7 + (lVar33 * lVar21 + lVar37) * (long)iVar34,stride_rem,
                       pcVar32 + (lVar22 * lVar24 + lVar36) * (long)iVar34,stride_loc,count,
                       (int)lVar31,(int)uVar39);
          }
        }
        for (lVar13 = 0; lVar28 != lVar13; lVar13 = lVar13 + 1) {
          if (lVar42 == lVar13) {
            lVar18 = hi_loc[lVar42];
            lo_rem[lVar42] = lVar18 + 1;
            hi_rem[lVar42] = lVar18 + lVar5;
            lVar40 = 1;
            if (dims[lVar42] < lVar18 + lVar5) {
              lVar40 = (ulong)(lVar18 < dims[lVar42]) + 1;
            }
          }
          else {
            lo_rem[lVar13] = lo_loc[lVar13];
            hi_rem[lVar13] = hi_loc[lVar13];
          }
        }
        lVar13 = 0;
        if (lVar40 != 0) {
          lVar13 = lVar40;
        }
        for (lVar18 = 0; lVar18 != lVar13; lVar18 = lVar18 + 1) {
          for (lVar14 = 0; lVar28 != lVar14; lVar14 = lVar14 + 1) {
            if (lVar42 == lVar14 && lVar40 == 2) {
              if (lVar18 == 0) {
                slo_rem[lVar42] = lo_rem[lVar42];
                lVar21 = dims[lVar42];
              }
              else {
                slo_rem[lVar42] = 1;
                lVar21 = hi_rem[lVar42] - dims[lVar42];
              }
LAB_001739f1:
              shi_rem[lVar42] = lVar21;
            }
            else if (lVar42 == lVar14) {
              lVar21 = hi_rem[lVar42];
              if (lVar21 <= dims[lVar42]) {
                slo_rem[lVar42] = lo_rem[lVar42];
                goto LAB_001739f1;
              }
              slo_rem[lVar42] = 1;
              shi_rem[lVar42] = lVar5;
            }
            else {
              slo_rem[lVar14] = lo_rem[lVar14];
              shi_rem[lVar14] = hi_rem[lVar14];
            }
          }
          lVar11 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
          if (lVar11 == 0) {
            builtin_strncpy(err_string,"cannot locate region: ",0x17);
            strcpy(err_string + 0x16,GA[lVar1].name);
            sVar15 = strlen(err_string);
            sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
            sVar15 = strlen(err_string);
            lVar14 = 1;
            while( true ) {
              IVar16 = pnga_ndim(g_a);
              pcVar32 = err_string + (int)sVar15;
              if (IVar16 <= lVar14) break;
              sprintf(pcVar32,",%ld:%ld ",slo_rem[lVar14],shi_rem[lVar14]);
              sVar15 = strlen(err_string);
              lVar14 = lVar14 + 1;
            }
            pcVar32[0] = ']';
            pcVar32[1] = '\0';
            pnga_error(err_string,g_a);
          }
          for (lVar14 = 0; lVar14 < np; lVar14 = lVar14 + 1) {
            uVar39 = proclist[lVar14];
            pnga_distribution(g_a,uVar39,tlo_rem,thi_rem);
            for (lVar21 = 0; lVar28 != lVar21; lVar21 = lVar21 + 1) {
              if (increment[lVar21] == 0) {
                if (lVar42 == lVar21) {
                  if (np == 1 && lVar40 == 1) {
                    lVar33 = width[lVar42];
                    plo_rem[lVar42] = lVar33;
                    phi_rem[lVar42] = lVar33 * 2 + -1;
                    lVar33 = (lVar33 + hi_loc[lVar42]) - lo_loc[lVar42];
                  }
                  else {
                    lVar33 = shi_rem[lVar42];
                    if (thi_rem[lVar42] < shi_rem[lVar42]) {
                      lVar33 = thi_rem[lVar42];
                    }
                    lVar23 = ~hi_loc[lVar42] + tlo_rem[lVar42];
                    if (lVar23 < 0) {
                      IVar16 = dims[lVar42];
                      lVar23 = lVar23 + IVar16;
                    }
                    else {
                      IVar16 = dims[lVar42];
                    }
                    lVar22 = 0;
                    if (IVar16 <= lVar23) {
                      lVar22 = IVar16;
                    }
                    lVar36 = width[lVar42];
                    plo_rem[lVar42] = lVar36;
                    phi_rem[lVar42] = (lVar33 - tlo_rem[lVar42]) + lVar36;
                    lVar33 = (hi_loc[lVar42] + lVar36 + lVar23) - (lVar22 + lo_loc[lVar42]);
                  }
                  plo_loc[lVar42] = lVar33 + 1;
                }
                else {
                  lVar33 = width[lVar21];
                  plo_rem[lVar21] = lVar33;
                  phi_rem[lVar21] = (thi_rem[lVar21] + lVar33) - tlo_rem[lVar21];
                  plo_loc[lVar21] = lVar33;
                }
              }
              else {
                plo_rem[lVar21] = 0;
                phi_rem[lVar21] = (increment[lVar21] + thi_rem[lVar21]) - tlo_rem[lVar21];
                plo_loc[lVar21] = 0;
              }
            }
            uVar29 = GA[lVar1].ndim;
            lVar21 = (long)(short)uVar29;
            iVar35 = GA[lVar1].distr_type;
            if (iVar35 - 1U < 3) {
              lVar23 = lVar12 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar23;
              IVar16 = proc;
              lVar33 = 0;
              while (lVar33 + 1 < lVar21) {
                IVar16 = (long)((int)IVar16 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar33];
                lVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                _index[lVar33 + 1] = (int)lVar23;
                lVar33 = lVar33 + 1;
              }
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              for (lVar33 = 0; (ulong)uVar10 * 4 != lVar33; lVar33 = lVar33 + 4) {
                iVar34 = *(int *)((long)_index + lVar33);
                lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                *(long *)(err_string + lVar33 * 2) = lVar23 * iVar34 + 1;
                lVar23 = ((long)iVar34 + 1) * lVar23;
                lVar22 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                if (lVar22 <= lVar23) {
                  lVar23 = lVar22;
                }
                *(long *)((long)_hi + lVar33 * 2) = lVar23;
              }
            }
            else if (iVar35 == 4) {
              lVar23 = lVar12 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar23;
              IVar16 = proc;
              lVar33 = 0;
              while (lVar33 + 1 < lVar21) {
                IVar16 = (long)((int)IVar16 - (int)lVar23) / GA[g_a + 1000].num_blocks[lVar33];
                lVar23 = (long)(int)IVar16 % GA[g_a + 1000].num_blocks[lVar33 + 1];
                _index[lVar33 + 1] = (int)lVar23;
                lVar33 = lVar33 + 1;
              }
              lVar33 = 0;
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              iVar34 = 0;
              for (; (ulong)uVar10 * 4 != lVar33; lVar33 = lVar33 + 4) {
                pCVar8 = GA[lVar1].mapc;
                iVar30 = *(int *)((long)_index + lVar33);
                lVar22 = (long)iVar34 + (long)iVar30;
                *(C_Integer *)(err_string + lVar33 * 2) = pCVar8[lVar22];
                lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                if ((long)iVar30 < lVar23 + -1) {
                  lVar22 = pCVar8[lVar22 + 1] + -1;
                }
                else {
                  lVar22 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                }
                *(long *)((long)_hi + lVar33 * 2) = lVar22;
                iVar34 = iVar34 + (int)lVar23;
              }
            }
            else if (iVar35 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar33 = 0;
                if (0 < lVar21) {
                  lVar33 = lVar21;
                }
                lVar23 = 1;
                for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                  lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar22];
                }
                if ((proc < 0) || (lVar23 <= proc)) {
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lo_rem[lVar23 + -0x20] = 0;
                    _hi[lVar23] = -1;
                  }
                }
                else {
                  lVar22 = 0;
                  IVar16 = proc;
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lVar24 = (long)GA[g_a + 1000].nblock[lVar23];
                    lVar36 = IVar16 % lVar24;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar23 + -0x20] = pCVar8[lVar36 + lVar22];
                    if (lVar36 == lVar24 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar23];
                    }
                    else {
                      CVar27 = pCVar8[lVar36 + lVar22 + 1] + -1;
                    }
                    lVar22 = lVar22 + lVar24;
                    _hi[lVar23] = CVar27;
                    IVar16 = IVar16 / lVar24;
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                lVar33 = 0;
                if (0 < lVar21) {
                  lVar33 = lVar21;
                }
                lVar23 = 1;
                for (lVar22 = 0; lVar33 != lVar22; lVar22 = lVar22 + 1) {
                  lVar23 = lVar23 * GA[g_a + 1000].nblock[lVar22];
                }
                if ((proc < 0) || (lVar23 <= proc)) {
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lo_rem[lVar23 + -0x20] = 0;
                    _hi[lVar23] = -1;
                  }
                }
                else {
                  lVar22 = 0;
                  IVar16 = proc;
                  for (lVar23 = 0; lVar33 != lVar23; lVar23 = lVar23 + 1) {
                    lVar24 = (long)GA[g_a + 1000].nblock[lVar23];
                    lVar36 = IVar16 % lVar24;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar23 + -0x20] = pCVar8[lVar36 + lVar22];
                    if (lVar36 == lVar24 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar23];
                    }
                    else {
                      CVar27 = pCVar8[lVar36 + lVar22 + 1] + -1;
                    }
                    lVar22 = lVar22 + lVar24;
                    _hi[lVar23] = CVar27;
                    IVar16 = IVar16 / lVar24;
                  }
                }
              }
              else {
                iVar34 = 0;
                if (0 < (short)uVar29) {
                  iVar34 = (int)(short)uVar29;
                }
                for (lVar33 = 0; iVar34 != lVar33; lVar33 = lVar33 + 1) {
                  lo_rem[lVar33 + -0x20] = 0;
                  _hi[lVar33] = -1;
                }
              }
            }
            lVar33 = lVar21 + -1;
            if (lVar33 == 0) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar23 = 0;
            if (0 < lVar33) {
              lVar23 = lVar33;
            }
            lVar22 = 1;
            lVar36 = 0;
            for (lVar24 = 0; lVar23 != lVar24; lVar24 = lVar24 + 1) {
              lVar36 = lVar36 + plo_loc[lVar24] * lVar22;
              lVar37 = (_hi[lVar24] - lo_rem[lVar24 + -0x20]) + GA[g_a + 1000].width[lVar24] * 2 + 1
              ;
              ld_loc[lVar24] = lVar37;
              lVar22 = lVar22 * lVar37;
            }
            lVar24 = plo_loc[lVar21 + -1];
            ppcVar6 = GA[lVar1].ptr;
            iVar34 = GA[lVar1].elemsize;
            pcVar32 = ppcVar6[proc];
            if (iVar35 - 1U < 3) {
              lVar25 = (long)(int)uVar39 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar25;
              uVar17 = uVar39;
              lVar37 = 0;
              while (lVar37 + 1 < lVar21) {
                uVar17 = (long)((int)uVar17 - (int)lVar25) / GA[g_a + 1000].num_blocks[lVar37];
                lVar25 = (long)(int)uVar17 % GA[g_a + 1000].num_blocks[lVar37 + 1];
                _index[lVar37 + 1] = (int)lVar25;
                lVar37 = lVar37 + 1;
              }
              uVar10 = 0;
              if (0 < (short)uVar29) {
                uVar10 = uVar29;
              }
              for (lVar37 = 0; (ulong)uVar10 * 4 != lVar37; lVar37 = lVar37 + 4) {
                iVar35 = *(int *)((long)_index + lVar37);
                lVar25 = *(long *)((long)GA[g_a + 1000].block_dims + lVar37 * 2);
                *(long *)(err_string + lVar37 * 2) = lVar25 * iVar35 + 1;
                lVar25 = ((long)iVar35 + 1) * lVar25;
                lVar38 = *(long *)((long)GA[g_a + 1000].dims + lVar37 * 2);
                if (lVar38 <= lVar25) {
                  lVar25 = lVar38;
                }
                *(long *)((long)_hi + lVar37 * 2) = lVar25;
              }
            }
            else if (iVar35 == 4) {
              lVar25 = (long)(int)uVar39 % GA[lVar1].num_blocks[0];
              _index[0] = (int)lVar25;
              uVar17 = uVar39;
              lVar37 = 0;
              while (lVar37 + 1 < lVar21) {
                uVar17 = (long)((int)uVar17 - (int)lVar25) / GA[g_a + 1000].num_blocks[lVar37];
                lVar25 = (long)(int)uVar17 % GA[g_a + 1000].num_blocks[lVar37 + 1];
                _index[lVar37 + 1] = (int)lVar25;
                lVar37 = lVar37 + 1;
              }
              lVar37 = 0;
              if ((short)uVar29 < 1) {
                uVar29 = 0;
              }
              iVar35 = 0;
              for (; (ulong)uVar29 * 4 != lVar37; lVar37 = lVar37 + 4) {
                pCVar8 = GA[lVar1].mapc;
                iVar30 = *(int *)((long)_index + lVar37);
                lVar38 = (long)iVar35 + (long)iVar30;
                *(C_Integer *)(err_string + lVar37 * 2) = pCVar8[lVar38];
                lVar25 = *(long *)((long)GA[lVar1].num_blocks + lVar37 * 2);
                if ((long)iVar30 < lVar25 + -1) {
                  lVar38 = pCVar8[lVar38 + 1] + -1;
                }
                else {
                  lVar38 = *(long *)((long)GA[lVar1].dims + lVar37 * 2);
                }
                *(long *)((long)_hi + lVar37 * 2) = lVar38;
                iVar35 = iVar35 + (int)lVar25;
              }
            }
            else if (iVar35 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                lVar37 = lVar21;
                if (lVar21 < 1) {
                  lVar37 = 0;
                }
                lVar25 = 1;
                for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                  lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar38];
                }
                if (((long)uVar39 < 0) || (lVar25 <= (long)uVar39)) {
                  for (lVar25 = 0; lVar37 != lVar25; lVar25 = lVar25 + 1) {
                    lo_rem[lVar25 + -0x20] = 0;
                    _hi[lVar25] = -1;
                  }
                }
                else {
                  lVar25 = 0;
                  uVar17 = uVar39;
                  for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                    lVar41 = (long)GA[g_a + 1000].nblock[lVar38];
                    lVar26 = (long)uVar17 % lVar41;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar38 + -0x20] = pCVar8[lVar26 + lVar25];
                    if (lVar26 == lVar41 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar38];
                    }
                    else {
                      CVar27 = pCVar8[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar41;
                    _hi[lVar38] = CVar27;
                    uVar17 = (long)uVar17 / lVar41;
                  }
                }
              }
              else if ((long)uVar39 < GA[lVar1].num_rstrctd) {
                lVar37 = lVar21;
                if (lVar21 < 1) {
                  lVar37 = 0;
                }
                lVar25 = 1;
                for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                  lVar25 = lVar25 * GA[g_a + 1000].nblock[lVar38];
                }
                if (((long)uVar39 < 0) || (lVar25 <= (long)uVar39)) {
                  for (lVar25 = 0; lVar37 != lVar25; lVar25 = lVar25 + 1) {
                    lo_rem[lVar25 + -0x20] = 0;
                    _hi[lVar25] = -1;
                  }
                }
                else {
                  lVar25 = 0;
                  uVar17 = uVar39;
                  for (lVar38 = 0; lVar37 != lVar38; lVar38 = lVar38 + 1) {
                    lVar41 = (long)GA[g_a + 1000].nblock[lVar38];
                    lVar26 = (long)uVar17 % lVar41;
                    pCVar8 = GA[lVar1].mapc;
                    lo_rem[lVar38 + -0x20] = pCVar8[lVar26 + lVar25];
                    if (lVar26 == lVar41 + -1) {
                      CVar27 = GA[g_a + 1000].dims[lVar38];
                    }
                    else {
                      CVar27 = pCVar8[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar41;
                    _hi[lVar38] = CVar27;
                    uVar17 = (long)uVar17 / lVar41;
                  }
                }
              }
              else {
                iVar35 = 0;
                if (0 < (short)uVar29) {
                  iVar35 = (int)(short)uVar29;
                }
                for (lVar37 = 0; iVar35 != lVar37; lVar37 = lVar37 + 1) {
                  lo_rem[lVar37 + -0x20] = 0;
                  _hi[lVar37] = -1;
                }
              }
            }
            if (lVar33 == 0) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + GA[lVar1].width[0] * 2 + 1;
            }
            lVar33 = 1;
            lVar37 = 0;
            for (lVar25 = 0; lVar23 != lVar25; lVar25 = lVar25 + 1) {
              lVar37 = lVar37 + plo_rem[lVar25] * lVar33;
              lVar38 = (_hi[lVar25] - lo_rem[lVar25 + -0x20]) + GA[g_a + 1000].width[lVar25] * 2 + 1
              ;
              ld_rem[lVar25] = lVar38;
              lVar33 = lVar33 * lVar38;
            }
            lVar21 = *(long *)(stride_loc + lVar21 * 2 + 6);
            pcVar7 = ppcVar6[uVar39];
            stride_loc[0] = iVar2;
            stride_rem[0] = iVar2;
            iVar35 = iVar2;
            iVar30 = iVar2;
            for (lVar23 = 0; lVar20 << 2 != lVar23; lVar23 = lVar23 + 4) {
              iVar35 = iVar35 * *(int *)((long)ld_rem + lVar23 * 2);
              *(int *)((long)stride_rem + lVar23) = iVar35;
              iVar30 = iVar30 * *(int *)((long)ld_loc + lVar23 * 2);
              *(int *)((long)stride_loc + lVar23) = iVar30;
              *(int *)((long)stride_rem + lVar23 + 4) = iVar35;
              *(int *)((long)stride_loc + lVar23 + 4) = iVar30;
            }
            for (lVar23 = 0; lVar28 != lVar23; lVar23 = lVar23 + 1) {
              count[lVar23] = ((int)phi_rem[lVar23] - (int)plo_rem[lVar23]) + 1;
            }
            count[0] = count[0] * iVar2;
            if (-1 < iVar4) {
              uVar39 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar39];
            }
            ARMCI_GetS(pcVar7 + (lVar33 * lVar21 + lVar37) * (long)iVar34,stride_rem,
                       pcVar32 + (lVar22 * lVar24 + lVar36) * (long)iVar34,stride_loc,count,
                       (int)lVar31,(int)uVar39);
          }
        }
      }
      if (lVar42 < lVar31) {
        pnga_pgroup_sync(grp_id);
      }
      if (iVar3 != 0) {
        increment[lVar42] = lVar5 * 2;
      }
    }
    free(map);
    free(proclist);
  }
  return;
}

Assistant:

void pnga_update1_ghosts(Integer g_a)
{
  Integer idx, ipx, inx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, offset, slice, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM], imax=0;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int corner_flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM], count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  logical hasData = TRUE;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

 /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. If lo_rem[] and hi_rem[] cross a global
   *        array boundary, as opposed to being entirely located on one
   *       side or the other of the array, then two sets of slo_rem[] and
   *       shi_rem[] will be created. One set will correspond to the
   *       block of data on one side of the global array boundary and the
   *       other set will correspond to the remaining block. This
   *       situation will only occur if the value of the ghost cell width
   *       is greater than the dimension of the visible global array
   *       data on a single processor.
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   *
   * For the case where the width of the ghost cells is more than the
   * width of the visible data held on a processor, special problems
   * arise. It now takes several updates to fill in one block of boundary
   * data and it is now necessary to keep track of where each of these
   * blocks of data go in the ghost cell region. To do this two extra
   * variables are needed. These are offset and slice. Slice is equal to
   * the width of the visible data along the dimension being updated
   * minus one coming from the remote processor. Offset is the amount
   * that this data must be moved inward from the lower boundary of the
   * ghost cell region. Another variable that is also used to handle
   * this case is imax. If this variable is set to 2, then this means
   * that the block of data that is needed to update the ghost cells
   * crosses a global array boundary and the block needs to be broken
   * up into two pieces. */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  corner_flag = GA[handle].corner_flag;
  p_handle = GA[handle].p_handle;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) hasData = FALSE;
  }

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = (Integer)width[idx];

    /* Do not bother with update if nwidth is zero or processor has
       no data */
    if (nwidth != 0 && hasData) {

      /* Perform update in negative direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = lo_loc[i] - nwidth;
          hi_rem[i] = lo_loc[i] - 1;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (lo_rem[i] < 1) {
            if (hi_rem[i] > 0) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i];
            } else {
              slo_rem[i] = lo_rem[i] + dims[i];
              shi_rem[i] = dims[i];
            }
          } else if (i == idx) {
            if (lo_rem[i] < 1) {
              slo_rem[i] = dims[i] - nwidth + 1;
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + 1;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = 0;
                  /*phi_loc[i] = width[i] - 1;*/
                } else {
                  if (tlo_rem[i] >= slo_rem[i]) {
                    offset = tlo_rem[i] - lo_rem[i];
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    offset = 0;
                    slice = thi_rem[i] - slo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] - slice;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = offset;
                  /*phi_loc[i] = offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }

      /* Perform update in positive direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = hi_loc[i] + 1;
          hi_rem[i] = hi_loc[i] + nwidth;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (hi_rem[i] > dims[i]) {
            if (lo_rem[i] <= dims[i]) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i] - dims[i];
            }
          } else if (i == idx) {
            if (hi_rem[i] > dims[i]) {
              slo_rem[i] = 1;
              shi_rem[i] = nwidth;
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = width[i];
                  phi_rem[i] = 2*width[i] - 1;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + 1 + width[i];
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i];*/
                } else {
                  offset = tlo_rem[i] - hi_loc[i] - 1;
                  if (thi_rem[i] <= shi_rem[i]) {
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    slice = shi_rem[i] - tlo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = width[i];
                  phi_rem[i] = width[i] + slice;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1 + offset;
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1
                    + offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    if (corner_flag)
      increment[idx] = 2*nwidth;
  }

  free(_ga_map);
  free(_ga_proclist);
}